

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::SwizzleOp::tokenize(SwizzleOp *this,GeneratorState *state,TokenStream *str)

{
  int iVar1;
  int iVar2;
  Random *this_00;
  VariableType *this_01;
  TokenStream *this_02;
  char *identifier;
  Token local_e8;
  Token local_d8 [2];
  int local_b4;
  string local_b0 [4];
  int elemNdx;
  string swizzleStr;
  char **swizzleSet;
  char *stpqSet [4];
  char *xyzwSet [4];
  char *rgbaSet [4];
  TokenStream *str_local;
  GeneratorState *state_local;
  SwizzleOp *this_local;
  
  xyzwSet[3] = "r";
  xyzwSet[1] = "z";
  xyzwSet[2] = "w";
  stpqSet[3] = "x";
  xyzwSet[0] = "y";
  stpqSet[1] = "p";
  stpqSet[2] = "q";
  swizzleSet = (char **)0xb14b2e;
  stpqSet[0] = "t";
  swizzleStr.field_2._8_8_ = 0;
  this_00 = GeneratorState::getRandom(state);
  iVar1 = de::Random::getInt(this_00,0,2);
  if (iVar1 == 0) {
    swizzleStr.field_2._8_8_ = xyzwSet + 3;
  }
  else if (iVar1 == 1) {
    swizzleStr.field_2._8_8_ = stpqSet + 3;
  }
  else if (iVar1 == 2) {
    swizzleStr.field_2._8_8_ = &swizzleSet;
  }
  std::__cxx11::string::string(local_b0);
  local_b4 = 0;
  while( true ) {
    iVar1 = local_b4;
    this_01 = ValueRange::getType(&this->m_outValueRange);
    iVar2 = VariableType::getNumElements(this_01);
    if (iVar2 <= iVar1) break;
    std::__cxx11::string::operator+=
              (local_b0,*(char **)(swizzleStr.field_2._8_8_ + (ulong)this->m_swizzle[local_b4] * 8))
    ;
    local_b4 = local_b4 + 1;
  }
  (*this->m_child->_vptr_Expression[3])(this->m_child,state,str);
  Token::Token(local_d8,DOT);
  this_02 = TokenStream::operator<<(str,local_d8);
  identifier = (char *)std::__cxx11::string::c_str();
  Token::Token(&local_e8,identifier);
  TokenStream::operator<<(this_02,&local_e8);
  Token::~Token(&local_e8);
  Token::~Token(local_d8);
  std::__cxx11::string::~string(local_b0);
  return;
}

Assistant:

void SwizzleOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	const char*		rgbaSet[]	= { "r", "g", "b", "a" };
	const char*		xyzwSet[]	= { "x", "y", "z", "w" };
	const char*		stpqSet[]	= { "s", "t", "p", "q" };
	const char**	swizzleSet	= DE_NULL;

	switch (state.getRandom().getInt(0, 2))
	{
		case 0: swizzleSet = rgbaSet; break;
		case 1: swizzleSet = xyzwSet; break;
		case 2: swizzleSet = stpqSet; break;
		default: DE_ASSERT(DE_FALSE);
	}

	std::string swizzleStr;
	for (int elemNdx = 0; elemNdx < m_outValueRange.getType().getNumElements(); elemNdx++)
		swizzleStr += swizzleSet[m_swizzle[elemNdx]];

	m_child->tokenize(state, str);
	str << Token::DOT << Token(swizzleStr.c_str());
}